

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::makeCompositeConstant(Builder *this,Id typeId,Vector<Id> *members,bool specConstant)

{
  Op typeClass;
  pointer puVar1;
  Op OVar2;
  Id IVar3;
  undefined7 in_register_00000009;
  Vector<Instruction_*> *this_00;
  int op;
  long lVar4;
  ulong uVar5;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  Instruction *c;
  
  OVar2 = OpConstantComposite;
  if ((int)CONCAT71(in_register_00000009,specConstant) != 0) {
    OVar2 = OpSpecConstantComposite;
  }
  if (typeId != 0) {
    typeClass = (this->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start[typeId]->opCode;
    uVar5 = (ulong)typeClass;
    if (((0x1e < uVar5) || ((0x51800000U >> (typeClass & OpTypeOpaque) & 1) == 0)) &&
       (typeClass != OpTypeCooperativeMatrixKHR)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                    ,0x3d9,
                    "Id spv::Builder::makeCompositeConstant(Id, const dxil_spv::Vector<Id> &, bool)"
                   );
    }
    if ((!specConstant) && (IVar3 = findCompositeConstant(this,typeClass,members), IVar3 != 0)) {
      return IVar3;
    }
    local_40._M_head_impl = (Instruction *)dxil_spv::allocate_in_thread(0x38);
    IVar3 = this->uniqueId + 1;
    this->uniqueId = IVar3;
    (local_40._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_001e31e0;
    (local_40._M_head_impl)->resultId = IVar3;
    (local_40._M_head_impl)->typeId = typeId;
    (local_40._M_head_impl)->opCode = OVar2;
    ((local_40._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_40._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_40._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_40._M_head_impl)->block = (Block *)0x0;
    c = local_40._M_head_impl;
    for (lVar4 = 0;
        puVar1 = (members->
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start,
        lVar4 < (int)((ulong)((long)(members->
                                    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 2
                     ); lVar4 = lVar4 + 1) {
      Instruction::addIdOperand(local_40._M_head_impl,puVar1[lVar4]);
    }
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
    if (local_40._M_head_impl != (Instruction *)0x0) {
      (*(local_40._M_head_impl)->_vptr_Instruction[1])();
    }
    this_00 = this->groupedConstants + uVar5;
    if (uVar5 == 0x1168) {
      this_00 = &this->coopmatConstants;
    }
    std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::push_back
              (this_00,&c);
    Module::mapInstruction(&this->module,c);
    return c->resultId;
  }
  __assert_fail("typeId",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                ,0x3ce,
                "Id spv::Builder::makeCompositeConstant(Id, const dxil_spv::Vector<Id> &, bool)");
}

Assistant:

Id Builder::makeCompositeConstant(Id typeId, const dxil_spv::Vector<Id>& members, bool specConstant)
{
    Op opcode = specConstant ? OpSpecConstantComposite : OpConstantComposite;
    assert(typeId);
    Op typeClass = getTypeClass(typeId);

    switch (typeClass) {
    case OpTypeVector:
    case OpTypeArray:
    case OpTypeStruct:
    case OpTypeMatrix:
    case OpTypeCooperativeMatrixKHR:
        break;
    default:
        assert(0);
        return makeFloatConstant(0.0);
    }

    if (! specConstant) {
        Id existing = findCompositeConstant(typeClass, members);
        if (existing)
            return existing;
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    for (int op = 0; op < (int)members.size(); ++op)
        c->addIdOperand(members[op]);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));

    if (typeClass == OpTypeCooperativeMatrixKHR)
        coopmatConstants.push_back(c);
    else
        groupedConstants[typeClass].push_back(c);

    module.mapInstruction(c);

    return c->getResultId();
}